

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACLoader.cpp
# Opt level: O2

aiNode * __thiscall
Assimp::AC3DImporter::ConvertObjectSection
          (AC3DImporter *this,Object *object,vector<aiMesh_*,_std::allocator<aiMesh_*>_> *meshes,
          vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *outMaterials,
          vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
          *materials,aiNode *parent)

{
  aiVector3D *paVar1;
  pointer paVar2;
  aiMesh *paVar3;
  vector<aiMesh*,std::allocator<aiMesh*>> *pvVar4;
  uint uVar5;
  ai_uint32 aVar6;
  aiNode *paVar7;
  Logger *pLVar8;
  ulong *puVar9;
  void *__s;
  undefined4 *puVar10;
  uint *puVar11;
  aiMesh *paVar12;
  aiMaterial *paVar13;
  ulong *puVar14;
  aiVector3D *__s_00;
  uint *puVar15;
  ulong uVar16;
  long lVar17;
  Subdivider *pSVar18;
  aiNode **ppaVar19;
  aiNode *paVar20;
  DeadlyImportError *pDVar21;
  int iVar22;
  long lVar23;
  pointer ppVar24;
  aiFace *paVar25;
  char *__format;
  pointer ppVar26;
  ulong uVar27;
  int iVar28;
  long lVar29;
  pointer pSVar30;
  AC3DImporter *pAVar31;
  aiVector3D *paVar32;
  aiFace *paVar33;
  pointer pSVar34;
  int iVar35;
  uint uVar36;
  pointer ppVar37;
  uint i;
  float fVar38;
  aiVector3t<float> aVar39;
  allocator_type local_131;
  aiVector3D *local_130;
  Object *local_128;
  aiNode *local_120;
  aiMesh *mesh;
  int local_10c;
  AC3DImporter *local_108;
  vector<aiMesh*,std::allocator<aiMesh*>> *local_100;
  pointer local_f8;
  vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_> *local_f0;
  ulong local_e8;
  pointer local_e0;
  aiFace *local_d8;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> cpy;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  float local_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  MatTable needMat;
  
  local_108 = this;
  local_100 = (vector<aiMesh*,std::allocator<aiMesh*>> *)meshes;
  local_f0 = materials;
  paVar7 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar7);
  paVar7->mParent = parent;
  local_120 = paVar7;
  if ((object->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (object->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_128 = object;
    if (((object->surfaces).
         super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
         ._M_impl.super__Vector_impl_data._M_finish ==
         (object->surfaces).
         super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
         ._M_impl.super__Vector_impl_data._M_start) || (object->numRefs == 0)) {
      pLVar8 = DefaultLogger::get();
      Logger::info(pLVar8,"AC3D: No surfaces defined in object definition, a point list is returned"
                  );
      paVar12 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(paVar12);
      pvVar4 = local_100;
      cpy.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)paVar12;
      std::vector<aiMesh*,std::allocator<aiMesh*>>::emplace_back<aiMesh*>(local_100,(aiMesh **)&cpy)
      ;
      paVar1 = *(aiVector3D **)(*(long *)(pvVar4 + 8) + -8);
      uVar27 = ((long)(object->vertices).
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(object->vertices).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0xc;
      fVar38 = (float)uVar27;
      paVar1->y = fVar38;
      paVar1->z = fVar38;
      uVar16 = uVar27 & 0xffffffff;
      puVar14 = (ulong *)operator_new__(uVar16 * 0x10 + 8);
      *puVar14 = uVar16;
      puVar14 = puVar14 + 1;
      if (uVar16 != 0) {
        puVar9 = puVar14;
        do {
          *(undefined4 *)puVar9 = 0;
          puVar9[1] = 0;
          puVar9 = puVar9 + 2;
        } while (puVar9 != puVar14 + uVar16 * 2);
      }
      *(ulong **)&paVar1[0x11].y = puVar14;
      uVar16 = (uVar27 & 0xffffffff) * 0xc;
      __s = operator_new__(uVar16);
      if (fVar38 != 0.0) {
        uVar16 = uVar16 - 0xc;
        memset(__s,0,(uVar16 - uVar16 % 0xc) + 0xc);
      }
      *(void **)&paVar1[1].y = __s;
      paVar2 = (local_128->vertices).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar23 = 0;
      local_130 = paVar1;
      for (uVar16 = 0; uVar16 < (uVar27 & 0xffffffff); uVar16 = uVar16 + 1) {
        *(undefined4 *)((undefined8 *)((long)__s + lVar23) + 1) =
             *(undefined4 *)((long)&paVar2->z + lVar23);
        *(undefined8 *)((long)__s + lVar23) = *(undefined8 *)((long)&paVar2->x + lVar23);
        *(undefined4 *)puVar14 = 1;
        puVar10 = (undefined4 *)operator_new__(4);
        puVar14[1] = (ulong)puVar10;
        *puVar10 = (int)uVar16;
        puVar14 = puVar14 + 2;
        lVar23 = lVar23 + 0xc;
      }
      local_130[0x13].y = 0.0;
      paVar13 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(paVar13);
      pAVar31 = (AC3DImporter *)outMaterials;
      cpy.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)paVar13;
      std::vector<aiMaterial*,std::allocator<aiMaterial*>>::emplace_back<aiMaterial*>
                ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)outMaterials,(aiMaterial **)&cpy
                );
      object = local_128;
      ConvertMaterial(pAVar31,local_128,
                      (local_f0->
                      super__Vector_base<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                      )._M_impl.super__Vector_impl_data._M_start,
                      (outMaterials->super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish[-1]);
      paVar7 = local_120;
    }
    else {
      cpy.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      std::
      vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::vector(&needMat,((long)(local_f0->
                               super__Vector_base<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_f0->
                              super__Vector_base<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                              )._M_impl.super__Vector_impl_data._M_start) / 0x58,(value_type *)&cpy,
               (allocator_type *)&mesh);
      local_f8 = (object->surfaces).
                 super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      for (pSVar34 = (object->surfaces).
                     super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
                     ._M_impl.super__Vector_impl_data._M_start; paVar7 = local_120,
          pSVar34 != local_f8; pSVar34 = pSVar34 + 1) {
        uVar36 = pSVar34->mat;
        if ((ulong)((long)needMat.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)needMat.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) <= (ulong)uVar36) {
          pLVar8 = DefaultLogger::get();
          uVar36 = 0;
          Logger::error(pLVar8,"AC3D: material index is out of range");
        }
        ppVar37 = (pSVar34->entries).
                  super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar26 = (pSVar34->entries).
                  super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (ppVar37 == ppVar26) {
          pLVar8 = DefaultLogger::get();
          Logger::warn(pLVar8,"AC3D: surface her zero vertex references");
          ppVar37 = (pSVar34->entries).
                    super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppVar26 = (pSVar34->entries).
                    super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        for (; ppVar37 != ppVar26; ppVar37 = ppVar37 + 1) {
          if ((ulong)(((long)(local_128->vertices).
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_128->vertices).
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0xc) <=
              (ulong)ppVar37->first) {
            pLVar8 = DefaultLogger::get();
            Logger::warn(pLVar8,"AC3D: Invalid vertex reference");
            ppVar37->first = 0;
          }
        }
        if (needMat.
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar36].first == 0) {
          local_120->mNumMeshes = local_120->mNumMeshes + 1;
        }
        uVar5 = pSVar34->flags & 0xf;
        if (uVar5 == 0) {
LAB_003d668f:
          needMat.
          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar36].first =
               needMat.
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar36].first + 1;
          iVar35 = (int)(((long)(pSVar34->entries).
                                super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pSVar34->entries).
                               super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0xc);
LAB_003d66a2:
          needMat.
          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar36].second =
               needMat.
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar36].second + iVar35;
        }
        else {
          if (uVar5 != 2) {
            if (uVar5 != 1) {
              pLVar8 = DefaultLogger::get();
              Logger::warn(pLVar8,"AC3D: The type flag of a surface is unknown");
              *(byte *)&pSVar34->flags = (byte)pSVar34->flags & 0xf0;
              goto LAB_003d668f;
            }
            needMat.
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar36].first =
                 needMat.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar36].first +
                 (int)(((long)(pSVar34->entries).
                              super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pSVar34->entries).
                             super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0xc);
            iVar35 = (int)(((long)(pSVar34->entries).
                                  super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pSVar34->entries).
                                 super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0xc) * 2;
            goto LAB_003d66a2;
          }
          needMat.
          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar36].first =
               ((int)(((long)(pSVar34->entries).
                             super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pSVar34->entries).
                            super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0xc) +
               needMat.
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar36].first) - 1;
          needMat.
          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar36].second =
               (needMat.
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar36].second +
               (int)(((long)(pSVar34->entries).
                            super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pSVar34->entries).
                           super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0xc) * 2) - 2;
        }
        object = local_128;
      }
      puVar11 = (uint *)operator_new__((ulong)local_120->mNumMeshes << 2);
      paVar7->mMeshes = puVar11;
      lVar23 = (long)*(pointer *)(local_100 + 8) - *(long *)local_100;
      paVar1 = &object->translation;
      uVar27 = 0;
      for (ppVar24 = needMat.
                     super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pvVar4 = local_100,
          ppVar24 !=
          needMat.
          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; ppVar24 = ppVar24 + 1) {
        if (ppVar24->first != 0) {
          *puVar11 = (uint)((ulong)(*(long *)(local_100 + 8) - *(long *)local_100) >> 3);
          local_e8 = uVar27;
          paVar12 = (aiMesh *)operator_new(0x520);
          aiMesh::aiMesh(paVar12);
          mesh = paVar12;
          std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                    ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)pvVar4,&mesh);
          mesh->mMaterialIndex =
               (uint)((ulong)((long)(outMaterials->
                                    super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(outMaterials->
                                   super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                                   _M_impl.super__Vector_impl_data._M_start) >> 3);
          paVar13 = (aiMaterial *)operator_new(0x10);
          aiMaterial::aiMaterial(paVar13);
          pAVar31 = (AC3DImporter *)outMaterials;
          cpy.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)paVar13;
          std::vector<aiMaterial*,std::allocator<aiMaterial*>>::emplace_back<aiMaterial*>
                    ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)outMaterials,
                     (aiMaterial **)&cpy);
          ConvertMaterial(pAVar31,object,
                          (local_f0->
                          super__Vector_base<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                          )._M_impl.super__Vector_impl_data._M_start + (local_e8 & 0xffffffff),
                          (outMaterials->
                          super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)._M_impl.
                          super__Vector_impl_data._M_finish[-1]);
          paVar12 = mesh;
          uVar36 = ppVar24->first;
          uVar27 = (ulong)uVar36;
          mesh->mNumFaces = uVar36;
          if (uVar27 == 0) {
            pDVar21 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&cpy,"AC3D: No faces",(allocator<char> *)&local_131);
            DeadlyImportError::DeadlyImportError(pDVar21,(string *)&cpy);
            __cxa_throw(pDVar21,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          if (0x1000000 < uVar36) {
            pDVar21 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&cpy,"AC3D: Too many faces, would run out of memory",
                       (allocator<char> *)&local_131);
            DeadlyImportError::DeadlyImportError(pDVar21,(string *)&cpy);
            __cxa_throw(pDVar21,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          puVar14 = (ulong *)operator_new__(uVar27 * 0x10 + 8);
          paVar3 = mesh;
          puVar11 = puVar11 + 1;
          *puVar14 = uVar27;
          paVar33 = (aiFace *)(puVar14 + 1);
          paVar25 = paVar33;
          do {
            paVar25->mNumIndices = 0;
            paVar25->mIndices = (uint *)0x0;
            paVar25 = paVar25 + 1;
          } while (paVar25 != (aiFace *)(puVar14 + uVar27 * 2 + 1));
          paVar12->mFaces = paVar33;
          paVar12->mNumVertices = ppVar24->second;
          uVar36 = mesh->mNumVertices;
          if ((ulong)uVar36 == 0) {
            pDVar21 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&cpy,"AC3D: No vertices",(allocator<char> *)&local_131);
            DeadlyImportError::DeadlyImportError(pDVar21,(string *)&cpy);
            __cxa_throw(pDVar21,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          if (0x1555555 < uVar36) {
            pDVar21 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&cpy,"AC3D: Too many vertices, would run out of memory",
                       (allocator<char> *)&local_131);
            DeadlyImportError::DeadlyImportError(pDVar21,(string *)&cpy);
            __cxa_throw(pDVar21,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar27 = (ulong)uVar36 * 0xc;
          __s_00 = (aiVector3D *)operator_new__(uVar27);
          uVar27 = uVar27 - 0xc;
          memset(__s_00,0,(uVar27 - (uVar27 & 0xffffffff) % 0xc) + 0xc);
          paVar3->mVertices = __s_00;
          if ((local_128->texture)._M_string_length == 0) {
            local_130 = (aiVector3D *)0x0;
          }
          else {
            uVar36 = paVar3->mNumVertices;
            uVar27 = (ulong)uVar36 * 0xc;
            local_130 = (aiVector3D *)operator_new__(uVar27);
            if (uVar36 != 0) {
              uVar27 = uVar27 - 0xc;
              memset(local_130,0,(uVar27 - uVar27 % 0xc) + 0xc);
            }
            paVar3->mTextureCoords[0] = local_130;
            paVar3->mNumUVComponents[0] = 2;
          }
          iVar35 = 0;
          pSVar30 = local_f8;
          uVar27 = local_e8;
          for (pSVar34 = (local_128->surfaces).
                         super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
                         ._M_impl.super__Vector_impl_data._M_start; object = local_128,
              paVar7 = local_120, pSVar34 != pSVar30; pSVar34 = pSVar34 + 1) {
            paVar25 = paVar33;
            if ((uint)uVar27 == pSVar34->mat) {
              ppVar37 = (pSVar34->entries).
                        super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              uVar36 = pSVar34->flags & 0xf;
              local_e0 = pSVar34;
              if (uVar36 == 0) {
                uVar16 = ((long)ppVar37 -
                         (long)(pSVar34->entries).
                               super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0xc;
                uVar36 = (uint)uVar16;
                paVar33->mNumIndices = uVar36;
                paVar25 = paVar33 + 1;
                if (uVar36 != 0) {
                  local_10c = iVar35;
                  local_d8 = paVar33 + 1;
                  puVar15 = (uint *)operator_new__((uVar16 & 0xffffffff) << 2);
                  paVar33->mIndices = puVar15;
                  lVar29 = 0;
                  paVar32 = local_130;
                  for (uVar27 = 0; uVar27 < paVar33->mNumIndices; uVar27 = uVar27 + 1) {
                    ppVar37 = (local_e0->entries).
                              super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    paVar33->mIndices[uVar27] = iVar35 + (int)uVar27;
                    lVar17 = (long)__s_00 + (lVar29 - (long)mesh->mVertices);
                    if (mesh->mNumVertices <= (uint)(lVar17 / 0xc)) {
                      pDVar21 = (DeadlyImportError *)__cxa_allocate_exception(0x10,0xc,lVar17 % 0xc)
                      ;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&cpy,"AC3D: Invalid number of vertices",
                                 (allocator<char> *)&local_131);
                      DeadlyImportError::DeadlyImportError(pDVar21,(string *)&cpy);
                      __cxa_throw(pDVar21,&DeadlyImportError::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    aVar39 = ::operator+((local_128->vertices).
                                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start +
                                         *(uint *)((long)&ppVar37->first + lVar29),paVar1);
                    *(long *)((long)&__s_00->x + lVar29) = aVar39._0_8_;
                    *(float *)((long)&__s_00->z + lVar29) = aVar39.z;
                    if (paVar32 == (aiVector3D *)0x0) {
                      paVar32 = (aiVector3D *)0x0;
                    }
                    else {
                      paVar32->x = *(float *)((long)&(ppVar37->second).x + lVar29);
                      paVar32->y = *(float *)((long)&(ppVar37->second).y + lVar29);
                      paVar32 = paVar32 + 1;
                    }
                    lVar29 = lVar29 + 0xc;
                  }
                  iVar35 = local_10c + (int)uVar27;
                  __s_00 = (aiVector3D *)((long)&__s_00->x + lVar29);
                  paVar25 = local_d8;
                  pSVar30 = local_f8;
                  uVar27 = local_e8;
                  pSVar34 = local_e0;
                  local_130 = paVar32;
                }
              }
              else {
                ppVar26 = (pSVar34->entries).
                          super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                lVar29 = 0;
                iVar22 = (int)(((long)ppVar37 - (long)ppVar26) / 0xc) - (uint)(uVar36 == 2);
                local_10c = iVar35;
                while( true ) {
                  iVar28 = (int)lVar29;
                  if (iVar22 == 0) break;
                  local_d8 = (aiFace *)CONCAT44(local_d8._4_4_,iVar22 + -1);
                  (&paVar33->mNumIndices)[lVar29 * 2] = 2;
                  puVar15 = (uint *)operator_new__(8);
                  (&paVar33->mIndices)[lVar29] = puVar15;
                  *puVar15 = iVar35 + iVar28;
                  (&paVar33->mIndices)[lVar29][1] = iVar35 + iVar28 + 1;
                  if (ppVar26 ==
                      (local_e0->entries).
                      super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
                    pDVar21 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&cpy,"AC3D: Bad line",(allocator<char> *)&local_131);
                    DeadlyImportError::DeadlyImportError(pDVar21,(string *)&cpy);
                    __cxa_throw(pDVar21,&DeadlyImportError::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  uVar27 = (ulong)ppVar26->first;
                  paVar2 = (local_128->vertices).
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  if ((ulong)(((long)(local_128->vertices).
                                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)paVar2) /
                             0xc) <= uVar27) {
                    __assert_fail("(*it2).first < object.vertices.size()",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/AC/ACLoader.cpp"
                                  ,0x2a3,
                                  "aiNode *Assimp::AC3DImporter::ConvertObjectSection(Object &, std::vector<aiMesh *> &, std::vector<aiMaterial *> &, const std::vector<Material> &, aiNode *)"
                                 );
                  }
                  __s_00->z = paVar2[uVar27].z;
                  fVar38 = paVar2[uVar27].y;
                  __s_00->x = paVar2[uVar27].x;
                  __s_00->y = fVar38;
                  if (local_130 == (aiVector3D *)0x0) {
                    local_130 = (aiVector3D *)0x0;
                  }
                  else {
                    local_130->x = (ppVar26->second).x;
                    local_130->y = (ppVar26->second).y;
                    local_130 = local_130 + 1;
                  }
                  if ((uVar36 == 1) && (iVar22 == 1)) {
                    ppVar26 = (local_e0->entries).
                              super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  }
                  else {
                    ppVar26 = ppVar26 + 1;
                  }
                  uVar5 = ppVar26->first;
                  paVar2 = (local_128->vertices).
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  __s_00[1].z = paVar2[uVar5].z;
                  paVar2 = paVar2 + uVar5;
                  fVar38 = paVar2->y;
                  __s_00[1].x = paVar2->x;
                  __s_00[1].y = fVar38;
                  if (local_130 == (aiVector3D *)0x0) {
                    local_130 = (aiVector3D *)0x0;
                  }
                  else {
                    local_130->x = (ppVar26->second).x;
                    local_130->y = (ppVar26->second).y;
                    local_130 = local_130 + 1;
                  }
                  paVar25 = paVar25 + 1;
                  __s_00 = __s_00 + 2;
                  lVar29 = lVar29 + 2;
                  iVar22 = (int)local_d8;
                }
                iVar35 = local_10c + iVar28;
                pSVar30 = local_f8;
                uVar27 = local_e8;
                pSVar34 = local_e0;
              }
            }
            paVar33 = paVar25;
          }
        }
        uVar27 = (ulong)((int)uVar27 + 1);
      }
      if (object->subDiv != 0) {
        if (local_108->configEvalSubdivision == true) {
          pSVar18 = Subdivider::Create(CATMULL_CLARKE);
          pLVar8 = DefaultLogger::get();
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cpy,
                         "AC3D: Evaluating subdivision surface: ",&object->name);
          Logger::info(pLVar8,(char *)cpy.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
          std::__cxx11::string::~string((string *)&cpy);
          pvVar4 = local_100;
          mesh = (aiMesh *)0x0;
          std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::vector
                    (&cpy,((long)*(pointer *)(local_100 + 8) - *(long *)local_100 >> 3) -
                          (lVar23 >> 3),&mesh,&local_131);
          (*pSVar18->_vptr_Subdivider[3])
                    (pSVar18,*(long *)pvVar4 + lVar23,
                     (long)cpy.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)cpy.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3,
                     cpy.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                     super__Vector_impl_data._M_start,(ulong)object->subDiv,1);
          if ((long)cpy.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)cpy.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                    super__Vector_impl_data._M_start != 0) {
            memmove((void *)(lVar23 + *(long *)local_100),
                    cpy.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)cpy.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)cpy.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
          }
          std::_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>::~_Vector_base
                    (&cpy.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>);
          (*pSVar18->_vptr_Subdivider[1])(pSVar18);
        }
        else {
          pLVar8 = DefaultLogger::get();
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cpy,
                         "AC3D: Letting the subdivision surface untouched due to my configuration: "
                         ,&object->name);
          Logger::info(pLVar8,(char *)cpy.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
          std::__cxx11::string::~string((string *)&cpy);
        }
      }
      std::
      _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::~_Vector_base(&needMat.
                       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     );
    }
  }
  uVar27 = (object->name)._M_string_length;
  if (uVar27 == 0) {
    switch(object->type) {
    case World:
      local_108->worlds = local_108->worlds + 1;
      __format = "ACWorld_%i";
      break;
    case Poly:
      local_108->polys = local_108->polys + 1;
      __format = "ACPoly_%i";
      break;
    case Group:
      local_108->groups = local_108->groups + 1;
      __format = "ACGroup_%i";
      break;
    default:
      goto switchD_003d6f92_caseD_3;
    case Light:
      local_108->lights = local_108->lights + 1;
      __format = "ACLight_%i";
    }
    aVar6 = snprintf((paVar7->mName).data,0x400,__format);
    (paVar7->mName).length = aVar6;
  }
  else if (uVar27 < 0x400) {
    (paVar7->mName).length = (ai_uint32)uVar27;
    memcpy((paVar7->mName).data,(object->name)._M_dataplus._M_p,uVar27);
    (paVar7->mName).data[uVar27] = '\0';
  }
switchD_003d6f92_caseD_3:
  aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&cpy,&object->rotation);
  paVar20 = local_120;
  (paVar7->mTransformation).d1 = local_a0;
  (paVar7->mTransformation).d2 = fStack_9c;
  (paVar7->mTransformation).d3 = fStack_98;
  (paVar7->mTransformation).d4 = fStack_94;
  (paVar7->mTransformation).c1 = local_b0;
  (paVar7->mTransformation).c2 = fStack_ac;
  (paVar7->mTransformation).c3 = fStack_a8;
  (paVar7->mTransformation).c4 = fStack_a4;
  *(pointer *)&(paVar7->mTransformation).b1 =
       cpy.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (paVar7->mTransformation).b3 = (float)uStack_b8;
  (paVar7->mTransformation).b4 = (float)uStack_b4;
  *(pointer *)&paVar7->mTransformation =
       cpy.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
       _M_start;
  *(pointer *)&(paVar7->mTransformation).a3 =
       cpy.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if ((object->type == Group) || (object->numRefs == 0)) {
    (paVar7->mTransformation).a4 = (object->translation).x;
    (paVar7->mTransformation).b4 = (object->translation).y;
    (paVar7->mTransformation).c4 = (object->translation).z;
  }
  lVar23 = (long)(object->children).
                 super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(object->children).
                 super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (lVar23 != 0) {
    uVar27 = lVar23 / 0xe0;
    local_120->mNumChildren = (uint)uVar27;
    ppaVar19 = (aiNode **)operator_new__((uVar27 & 0xffffffff) << 3);
    paVar20->mChildren = ppaVar19;
    lVar23 = 0;
    for (uVar16 = 0; paVar7 = local_120, uVar16 < (uVar27 & 0xffffffff); uVar16 = uVar16 + 1) {
      paVar20 = ConvertObjectSection
                          (local_108,
                           (Object *)
                           ((long)&((object->children).
                                    super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->type + lVar23),
                           (vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_100,outMaterials,
                           local_f0,local_120);
      paVar7->mChildren[uVar16] = paVar20;
      uVar27 = (ulong)paVar7->mNumChildren;
      lVar23 = lVar23 + 0xe0;
    }
  }
  return local_120;
}

Assistant:

aiNode* AC3DImporter::ConvertObjectSection(Object& object,
    std::vector<aiMesh*>& meshes,
    std::vector<aiMaterial*>& outMaterials,
    const std::vector<Material>& materials,
    aiNode* parent)
{
    aiNode* node = new aiNode();
    node->mParent = parent;
    if (object.vertices.size())
    {
        if (!object.surfaces.size() || !object.numRefs)
        {
            /* " An object with 7 vertices (no surfaces, no materials defined).
                 This is a good way of getting point data into AC3D.
                 The Vertex->create convex-surface/object can be used on these
                 vertices to 'wrap' a 3d shape around them "
                 (http://www.opencity.info/html/ac3dfileformat.html)

                 therefore: if no surfaces are defined return point data only
             */

            ASSIMP_LOG_INFO("AC3D: No surfaces defined in object definition, "
                "a point list is returned");

            meshes.push_back(new aiMesh());
            aiMesh* mesh = meshes.back();

            mesh->mNumFaces = mesh->mNumVertices = (unsigned int)object.vertices.size();
            aiFace* faces = mesh->mFaces = new aiFace[mesh->mNumFaces];
            aiVector3D* verts = mesh->mVertices = new aiVector3D[mesh->mNumVertices];

            for (unsigned int i = 0; i < mesh->mNumVertices;++i,++faces,++verts)
            {
                *verts = object.vertices[i];
                faces->mNumIndices = 1;
                faces->mIndices = new unsigned int[1];
                faces->mIndices[0] = i;
            }

            // use the primary material in this case. this should be the
            // default material if all objects of the file contain points
            // and no faces.
            mesh->mMaterialIndex = 0;
            outMaterials.push_back(new aiMaterial());
            ConvertMaterial(object, materials[0], *outMaterials.back());
        }
        else
        {
            // need to generate one or more meshes for this object.
            // find out how many different materials we have
            typedef std::pair< unsigned int, unsigned int > IntPair;
            typedef std::vector< IntPair > MatTable;
            MatTable needMat(materials.size(),IntPair(0,0));

            std::vector<Surface>::iterator it,end = object.surfaces.end();
            std::vector<Surface::SurfaceEntry>::iterator it2,end2;

            for (it = object.surfaces.begin(); it != end; ++it)
            {
                unsigned int idx = (*it).mat;
                if (idx >= needMat.size())
                {
                    ASSIMP_LOG_ERROR("AC3D: material index is out of range");
                    idx = 0;
                }
                if ((*it).entries.empty())
                {
                    ASSIMP_LOG_WARN("AC3D: surface her zero vertex references");
                }

                // validate all vertex indices to make sure we won't crash here
                for (it2  = (*it).entries.begin(),
                     end2 = (*it).entries.end(); it2 != end2; ++it2)
                {
                    if ((*it2).first >= object.vertices.size())
                    {
                        ASSIMP_LOG_WARN("AC3D: Invalid vertex reference");
                        (*it2).first = 0;
                    }
                }

                if (!needMat[idx].first)++node->mNumMeshes;

                switch ((*it).flags & 0xf)
                {
                    // closed line
                case 0x1:

                    needMat[idx].first  += (unsigned int)(*it).entries.size();
                    needMat[idx].second += (unsigned int)(*it).entries.size()<<1u;
                    break;

                    // unclosed line
                case 0x2:

                    needMat[idx].first  += (unsigned int)(*it).entries.size()-1;
                    needMat[idx].second += ((unsigned int)(*it).entries.size()-1)<<1u;
                    break;

                    // 0 == polygon, else unknown
                default:

                    if ((*it).flags & 0xf)
                    {
                        ASSIMP_LOG_WARN("AC3D: The type flag of a surface is unknown");
                        (*it).flags &= ~(0xf);
                    }

                    // the number of faces increments by one, the number
                    // of vertices by surface.numref.
                    needMat[idx].first++;
                    needMat[idx].second += (unsigned int)(*it).entries.size();
                };
            }
            unsigned int* pip = node->mMeshes = new unsigned int[node->mNumMeshes];
            unsigned int mat = 0;
            const size_t oldm = meshes.size();
            for (MatTable::const_iterator cit = needMat.begin(), cend = needMat.end();
                cit != cend; ++cit, ++mat)
            {
                if (!(*cit).first)continue;

                // allocate a new aiMesh object
                *pip++ = (unsigned int)meshes.size();
                aiMesh* mesh = new aiMesh();
                meshes.push_back(mesh);

                mesh->mMaterialIndex = (unsigned int)outMaterials.size();
                outMaterials.push_back(new aiMaterial());
                ConvertMaterial(object, materials[mat], *outMaterials.back());

                // allocate storage for vertices and normals
                mesh->mNumFaces = (*cit).first;
                if (mesh->mNumFaces == 0) {
                    throw DeadlyImportError("AC3D: No faces");
                } else if (mesh->mNumFaces > AI_MAX_ALLOC(aiFace)) {
                    throw DeadlyImportError("AC3D: Too many faces, would run out of memory");
                }
                aiFace* faces = mesh->mFaces = new aiFace[mesh->mNumFaces];

                mesh->mNumVertices = (*cit).second;
                if (mesh->mNumVertices == 0) {
                    throw DeadlyImportError("AC3D: No vertices");
                } else if (mesh->mNumVertices > AI_MAX_ALLOC(aiVector3D)) {
                    throw DeadlyImportError("AC3D: Too many vertices, would run out of memory");
                }
                aiVector3D* vertices = mesh->mVertices = new aiVector3D[mesh->mNumVertices];
                unsigned int cur = 0;

                // allocate UV coordinates, but only if the texture name for the
                // surface is not empty
                aiVector3D* uv = NULL;
                if(object.texture.length())
                {
                    uv = mesh->mTextureCoords[0] = new aiVector3D[mesh->mNumVertices];
                    mesh->mNumUVComponents[0] = 2;
                }

                for (it = object.surfaces.begin(); it != end; ++it)
                {
                    if (mat == (*it).mat)
                    {
                        const Surface& src = *it;

                        // closed polygon
                        unsigned int type = (*it).flags & 0xf;
                        if (!type)
                        {
                            aiFace& face = *faces++;
                            if((face.mNumIndices = (unsigned int)src.entries.size()))
                            {
                                face.mIndices = new unsigned int[face.mNumIndices];
                                for (unsigned int i = 0; i < face.mNumIndices;++i,++vertices)
                                {
                                    const Surface::SurfaceEntry& entry = src.entries[i];
                                    face.mIndices[i] = cur++;

                                    // copy vertex positions
                                    if (static_cast<unsigned>(vertices - mesh->mVertices) >= mesh->mNumVertices) {
                                        throw DeadlyImportError("AC3D: Invalid number of vertices");
                                    }
                                    *vertices = object.vertices[entry.first] + object.translation;


                                    // copy texture coordinates
                                    if (uv)
                                    {
                                        uv->x =  entry.second.x;
                                        uv->y =  entry.second.y;
                                        ++uv;
                                    }
                                }
                            }
                        }
                        else
                        {

                            it2  = (*it).entries.begin();

                            // either a closed or an unclosed line
                            unsigned int tmp = (unsigned int)(*it).entries.size();
                            if (0x2 == type)--tmp;
                            for (unsigned int m = 0; m < tmp;++m)
                            {
                                aiFace& face = *faces++;

                                face.mNumIndices = 2;
                                face.mIndices = new unsigned int[2];
                                face.mIndices[0] = cur++;
                                face.mIndices[1] = cur++;

                                // copy vertex positions
                                if (it2 == (*it).entries.end() ) {
                                    throw DeadlyImportError("AC3D: Bad line");
                                }
                                ai_assert((*it2).first < object.vertices.size());
                                *vertices++ = object.vertices[(*it2).first];

                                // copy texture coordinates
                                if (uv)
                                {
                                    uv->x =  (*it2).second.x;
                                    uv->y =  (*it2).second.y;
                                    ++uv;
                                }


                                if (0x1 == type && tmp-1 == m)
                                {
                                    // if this is a closed line repeat its beginning now
                                    it2  = (*it).entries.begin();
                                }
                                else ++it2;

                                // second point
                                *vertices++ = object.vertices[(*it2).first];

                                if (uv)
                                {
                                    uv->x =  (*it2).second.x;
                                    uv->y =  (*it2).second.y;
                                    ++uv;
                                }
                            }
                        }
                    }
                }
            }

            // Now apply catmull clark subdivision if necessary. We split meshes into
            // materials which is not done by AC3D during smoothing, so we need to
            // collect all meshes using the same material group.
            if (object.subDiv)  {
                if (configEvalSubdivision) {
                    std::unique_ptr<Subdivider> div(Subdivider::Create(Subdivider::CATMULL_CLARKE));
                    ASSIMP_LOG_INFO("AC3D: Evaluating subdivision surface: "+object.name);

                    std::vector<aiMesh*> cpy(meshes.size()-oldm,NULL);
                    div->Subdivide(&meshes[oldm],cpy.size(),&cpy.front(),object.subDiv,true);
                    std::copy(cpy.begin(),cpy.end(),meshes.begin()+oldm);

                    // previous meshes are deleted vy Subdivide().
                }
                else {
                    ASSIMP_LOG_INFO("AC3D: Letting the subdivision surface untouched due to my configuration: "
                        +object.name);
                }
            }
        }
    }

    if (object.name.length())
        node->mName.Set(object.name);
    else
    {
        // generate a name depending on the type of the node
        switch (object.type)
        {
        case Object::Group:
            node->mName.length = ::ai_snprintf(node->mName.data, MAXLEN, "ACGroup_%i",groups++);
            break;
        case Object::Poly:
            node->mName.length = ::ai_snprintf(node->mName.data, MAXLEN, "ACPoly_%i",polys++);
            break;
        case Object::Light:
            node->mName.length = ::ai_snprintf(node->mName.data, MAXLEN, "ACLight_%i",lights++);
            break;

            // there shouldn't be more than one world, but we don't care
        case Object::World:
            node->mName.length = ::ai_snprintf(node->mName.data, MAXLEN, "ACWorld_%i",worlds++);
            break;
        }
    }


    // setup the local transformation matrix of the object
    // compute the transformation offset to the parent node
    node->mTransformation = aiMatrix4x4 ( object.rotation );

    if (object.type == Object::Group || !object.numRefs)
    {
        node->mTransformation.a4 = object.translation.x;
        node->mTransformation.b4 = object.translation.y;
        node->mTransformation.c4 = object.translation.z;
    }

    // add children to the object
    if (object.children.size())
    {
        node->mNumChildren = (unsigned int)object.children.size();
        node->mChildren = new aiNode*[node->mNumChildren];
        for (unsigned int i = 0; i < node->mNumChildren;++i)
        {
            node->mChildren[i] = ConvertObjectSection(object.children[i],meshes,outMaterials,materials,node);
        }
    }

    return node;
}